

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_debug.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::ValidateLine(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  DiagnosticStream *pDVar2;
  string local_228;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *file;
  Instruction *pIStack_20;
  uint file_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  file._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,file._4_4_);
  if ((local_30 != (Instruction *)0x0) && (OVar1 = Instruction::opcode(local_30), OVar1 == OpString)
     ) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar2 = DiagnosticStream::operator<<(&local_208,(char (*) [20])"OpLine Target <id> ");
  ValidationState_t::getIdName_abi_cxx11_(&local_228,(ValidationState_t *)inst_local,file._4_4_);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_228);
  pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [21])" is not an OpString.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
  std::__cxx11::string::~string((string *)&local_228);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateLine(ValidationState_t& _, const Instruction* inst) {
  const auto file_id = inst->GetOperandAs<uint32_t>(0);
  const auto file = _.FindDef(file_id);
  if (!file || spv::Op::OpString != file->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpLine Target <id> " << _.getIdName(file_id)
           << " is not an OpString.";
  }
  return SPV_SUCCESS;
}